

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  ITracker *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  SectionTracker *this;
  int __oflag;
  SectionTracker *this_00;
  undefined1 local_48 [32];
  ITracker *childTracker;
  ITracker *currentTracker;
  SectionTracker *section;
  string *name_local;
  TrackerContext *ctx_local;
  
  currentTracker = (ITracker *)0x0;
  section = (SectionTracker *)name;
  name_local = (string *)ctx;
  childTracker = TrackerContext::currentTracker(ctx);
  this_00 = section;
  iVar3 = (*(childTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])();
  local_48._24_8_ = CONCAT44(extraout_var,iVar3);
  if ((ITracker *)local_48._24_8_ == (ITracker *)0x0) {
    this = (SectionTracker *)operator_new(0x60);
    SectionTracker(this,(string *)section,(TrackerContext *)name_local,childTracker);
    pIVar1 = childTracker;
    this_00 = (SectionTracker *)local_48;
    currentTracker = (ITracker *)this;
    Ptr<Catch::TestCaseTracking::ITracker>::Ptr
              ((Ptr<Catch::TestCaseTracking::ITracker> *)this_00,(ITracker *)this);
    (*(pIVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])();
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr((Ptr<Catch::TestCaseTracking::ITracker> *)local_48)
    ;
  }
  else {
    if ((ITracker *)local_48._24_8_ == (ITracker *)0x0) {
      __assert_fail("childTracker",
                    "/workspace/llm4binary/github/license_c_cmakelists/duckie[P]named_types/3rdparty/catch/catch.hpp"
                    ,0x1652,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const std::string &)"
                   );
    }
    uVar4 = (*(((ITracker *)local_48._24_8_)->super_SharedImpl<Catch::IShared>).super_IShared.
              super_NonCopyable._vptr_NonCopyable[0x10])();
    if ((uVar4 & 1) == 0) {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/duckie[P]named_types/3rdparty/catch/catch.hpp"
                    ,0x1653,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const std::string &)"
                   );
    }
    currentTracker = (ITracker *)local_48._24_8_;
  }
  bVar2 = TrackerContext::completedCycle((TrackerContext *)name_local);
  if (!bVar2) {
    uVar4 = (*(currentTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[5])();
    if ((uVar4 & 1) == 0) {
      TrackerBase::open((TrackerBase *)currentTracker,(char *)this_00,__oflag);
    }
  }
  return (SectionTracker *)currentTracker;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                assert( childTracker );
                assert( childTracker->isSectionTracker() );
                section = static_cast<SectionTracker*>( childTracker );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }